

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::mode1(gulcalc *this)

{
  bool bVar1;
  int iVar2;
  int *rec;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int recsize;
  EVP_PKEY_CTX *in_RSI;
  int event_id;
  
  init(this,in_RSI);
  iVar2 = (int)(((long)(this->damagebindictionary_vec_->
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->damagebindictionary_vec_->
                      super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)
                      ._M_impl.super__Vector_impl_data._M_start) / 0x14) * 8 + 0x10;
  event_id = -1;
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  rec = (int *)operator_new__((long)iVar2);
  if (this->benchmark_ == true) {
    outputbenchmark(this,0,true);
  }
  while (bVar1 = (*this->iGetrec_)((char *)rec,0xc), bVar1) {
    (*this->iGetrec_)((char *)(rec + 3),4);
    (*this->iGetrec_)((char *)(rec + 4),rec[3] << 3);
    iVar2 = *rec;
    recsize = extraout_EDX;
    if (iVar2 != event_id) {
      if (0 < event_id) {
        if (this->benchmark_ == true) {
          outputbenchmark(this,event_id,false);
        }
        outputmode1data(this,event_id);
        iVar2 = *rec;
        recsize = extraout_EDX_00;
      }
      event_id = iVar2;
      if (this->rndopt_ == usecachedvector) {
        getRands::clearvec(this->rnd_);
        recsize = extraout_EDX_01;
      }
    }
    processrec_mode1(this,(char *)rec,recsize);
  }
  if (this->benchmark_ == true) {
    outputbenchmark(this,*rec,false);
  }
  outputmode1data(this,*rec);
  if (this->itemWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->itemWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->lossWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->lossWriter_)(this->ibuf_,1,this->itembufoffset_);
  }
  if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    (*this->correlatedWriter_)(this->corrbuf_,1,this->correlatedbufoffset_);
  }
  operator_delete__(rec);
  return;
}

Assistant:

void gulcalc::mode1()
{
	// Change this 
	// collate the data as coverage_id,sidx,item_id,loss
	// then when the items are on the same coverage split the loss proportionally
	// process each event and output the data
	// 
	init();

	size_t total_bins = damagebindictionary_vec_->size();
	int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);
	int last_event_id = -1;

	char* rec = new char[max_recsize];
	damagecdfrec* d = (damagecdfrec*)rec;

	if (benchmark_) outputbenchmark(0, true);

	for (;;)
	{
		char* p = rec;
		bool bSuccess = iGetrec_(p, sizeof(damagecdfrec));
		if (bSuccess == false) break;
		p = p + sizeof(damagecdfrec);
		bSuccess = iGetrec_(p, sizeof(int)); // we now have bin count
		int* q = (int*)p;
		p = p + sizeof(int);
		int recsize = (*q) * sizeof(prob_mean);
		// we should now have damagecdfrec in memory
		bSuccess = iGetrec_(p, recsize);
		recsize += sizeof(damagecdfrec) + sizeof(int);
		if (d->event_id != last_event_id) {
			if (last_event_id > 0) {
				if (benchmark_) outputbenchmark(last_event_id);
				outputmode1data(last_event_id);
			}
			last_event_id = d->event_id;
			if (rndopt_ == rd_option::usecachedvector) rnd_->clearvec();
		}

		processrec_mode1(rec, recsize);
	}
	if (benchmark_) outputbenchmark(d->event_id);
	outputmode1data(d->event_id);

	if (itemWriter_) itemWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (lossWriter_) lossWriter_(ibuf_, sizeof(unsigned char), itembufoffset_);
	if (correlatedWriter_) correlatedWriter_(corrbuf_, sizeof(unsigned char), correlatedbufoffset_);
	delete[] rec;
}